

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<TestCountExpr>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,TestCountExpr>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
                *matcher_tuple,tuple<mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr> *value_tuple)

{
  MatcherInterface<mp::expr::Kind> *pMVar1;
  MatcherInterface<BasicTestExpr<1>_> *pMVar2;
  char cVar3;
  undefined1 uVar4;
  
  pMVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
           ).super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
           super_MatcherBase<mp::expr::Kind>.impl_.value_;
  cVar3 = (**(code **)(*(long *)pMVar1 + 0x20))
                    (pMVar1,(value_tuple->
                            super__Tuple_impl<0UL,_mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr>)
                            .super__Head_base<0UL,_mp::expr::Kind,_false>._M_head_impl);
  if (cVar3 == '\0') {
    uVar4 = 0;
  }
  else {
    pMVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
             .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
             super_MatcherBase<BasicTestExpr<1>_>.impl_.value_;
    uVar4 = (**(code **)(*(long *)pMVar2 + 0x20))
                      (pMVar2,(value_tuple->
                              super__Tuple_impl<0UL,_mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr>
                              ).super__Tuple_impl<1UL,_BasicTestExpr<1>,_TestCountExpr>.
                              super__Head_base<1UL,_BasicTestExpr<1>,_false>);
  }
  return (bool)uVar4;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }